

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv__fs_readdir_cleanup(uv_fs_t *req)

{
  long lVar1;
  int local_24;
  int i;
  uv_dirent_t *dirents;
  uv_dir_t *dir;
  uv_fs_t *req_local;
  
  if (req->ptr != (void *)0x0) {
    lVar1 = *req->ptr;
    req->ptr = (void *)0x0;
    if (lVar1 != 0) {
      for (local_24 = 0; (long)local_24 < req->result; local_24 = local_24 + 1) {
        uv__free(*(void **)(lVar1 + (long)local_24 * 0x10));
        *(undefined8 *)(lVar1 + (long)local_24 * 0x10) = 0;
      }
    }
  }
  return;
}

Assistant:

void uv__fs_readdir_cleanup(uv_fs_t* req) {
  uv_dir_t* dir;
  uv_dirent_t* dirents;
  int i;

  if (req->ptr == NULL)
    return;

  dir = req->ptr;
  dirents = dir->dirents;
  req->ptr = NULL;

  if (dirents == NULL)
    return;

  for (i = 0; i < req->result; ++i) {
    uv__free((char*) dirents[i].name);
    dirents[i].name = NULL;
  }
}